

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O3

bool WriteFakeManifests(string *dir,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  TimeStamp TVar4;
  bool bVar5;
  string command;
  RealDiskInterface disk_interface;
  string local_70;
  RealDiskInterface local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_50 = (RealDiskInterface)&PTR__FileReader_0012cc68;
  paVar1 = &local_70.field_2;
  pcVar2 = (dir->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + dir->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  TVar4 = RealDiskInterface::Stat(&local_50,&local_70,err);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (TVar4 == 0) {
    std::operator+(&local_70,"python misc/write_fake_manifests.py ",dir);
    printf("Creating manifest data...");
    fflush(_stdout);
    iVar3 = system(local_70._M_dataplus._M_p);
    puts("done.");
    bVar5 = iVar3 == 0;
    if (!bVar5) {
      std::operator+(&local_48,"Failed to run ",&local_70);
      std::__cxx11::string::operator=((string *)err,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = TVar4 != -1;
  }
  return bVar5;
}

Assistant:

bool WriteFakeManifests(const string& dir, string* err) {
  RealDiskInterface disk_interface;
  TimeStamp mtime = disk_interface.Stat(dir + "/build.ninja", err);
  if (mtime != 0)  // 0 means that the file doesn't exist yet.
    return mtime != -1;

  string command = "python misc/write_fake_manifests.py " + dir;
  printf("Creating manifest data..."); fflush(stdout);
  int exit_code = system(command.c_str());
  printf("done.\n");
  if (exit_code != 0)
    *err = "Failed to run " + command;
  return exit_code == 0;
}